

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_state_rest_resp(connectdata *conn,int ftpcode,ftpstate instate)

{
  CURLcode CVar1;
  char local_48 [8];
  char buffer [24];
  ftp_conn *ftpc;
  CURLcode result;
  ftpstate instate_local;
  int ftpcode_local;
  connectdata *conn_local;
  
  buffer._16_8_ = &conn->proto;
  if ((instate == FTP_REST) || (instate != FTP_RETR_REST)) {
    if (ftpcode == 0x15e) {
      builtin_strncpy(local_48,"Accept-r",8);
      builtin_strncpy(buffer,"anges: bytes\r\n",0xf);
      buffer[0xf] = '\0';
      CVar1 = Curl_client_write(conn,3,local_48,0);
      if (CVar1 != CURLE_OK) {
        return CVar1;
      }
    }
    ftpc._4_4_ = ftp_state_prepare_transfer(conn);
  }
  else if (ftpcode == 0x15e) {
    CVar1 = Curl_pp_sendf((pingpong *)buffer._16_8_,"RETR %s",(conn->proto).ftpc.file);
    if (CVar1 != CURLE_OK) {
      return CVar1;
    }
    _state(conn,FTP_RETR);
    ftpc._4_4_ = CURLE_OK;
  }
  else {
    Curl_failf(conn->data,"Couldn\'t use REST");
    ftpc._4_4_ = CURLE_FTP_COULDNT_USE_REST;
  }
  return ftpc._4_4_;
}

Assistant:

static CURLcode ftp_state_rest_resp(struct connectdata *conn,
                                    int ftpcode,
                                    ftpstate instate)
{
  CURLcode result = CURLE_OK;
  struct ftp_conn *ftpc = &conn->proto.ftpc;

  switch(instate) {
  case FTP_REST:
  default:
#ifdef CURL_FTP_HTTPSTYLE_HEAD
    if(ftpcode == 350) {
      char buffer[24]= { "Accept-ranges: bytes\r\n" };
      result = Curl_client_write(conn, CLIENTWRITE_BOTH, buffer, 0);
      if(result)
        return result;
    }
#endif
    result = ftp_state_prepare_transfer(conn);
    break;

  case FTP_RETR_REST:
    if(ftpcode != 350) {
      failf(conn->data, "Couldn't use REST");
      result = CURLE_FTP_COULDNT_USE_REST;
    }
    else {
      PPSENDF(&ftpc->pp, "RETR %s", ftpc->file);
      state(conn, FTP_RETR);
    }
    break;
  }

  return result;
}